

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void __thiscall FExecList::AddCommand(FExecList *this,char *cmd,char *file)

{
  int iVar1;
  int iVar2;
  char *file_00;
  int i;
  FCommandLine argv;
  
  argv.cmd = cmd;
  if (file == (char *)0x0) {
LAB_00377050:
    iVar1 = strncasecmp(cmd,"exec",4);
    if (iVar1 == 0) {
      iVar1 = isspace((int)cmd[4]);
      if (iVar1 != 0) {
        argv._argc = -1;
        argv._argv = (char **)0x0;
        argv.noescapes = false;
        iVar1 = 1;
        while( true ) {
          iVar2 = FCommandLine::argc(&argv);
          if (iVar2 <= iVar1) break;
          file_00 = FCommandLine::operator[](&argv,iVar1);
          C_ParseExecFile(file_00,this);
          iVar1 = iVar1 + 1;
        }
        goto LAB_00377107;
      }
    }
    FString::FString((FString *)&argv,cmd);
    TArray<FString,_FString>::Push(&this->Commands,(FString *)&argv);
    FString::~FString((FString *)&argv);
  }
  else {
    iVar1 = strncasecmp(cmd,"pullin",6);
    if (iVar1 != 0) goto LAB_00377050;
    iVar1 = isspace((int)cmd[6]);
    if (iVar1 == 0) goto LAB_00377050;
    argv._argc = -1;
    argv._argv = (char **)0x0;
    argv.noescapes = false;
    C_SearchForPullins(this,file,&argv);
LAB_00377107:
    FCommandLine::~FCommandLine(&argv);
  }
  return;
}

Assistant:

void FExecList::AddCommand(const char *cmd, const char *file)
{
	// Pullins are special and need to be separated from general commands.
	// They also turned out to be a really bad idea, since they make things
	// more complicated. :(
	if (file != NULL && strnicmp(cmd, "pullin", 6) == 0 && isspace(cmd[6]))
	{
		FCommandLine line(cmd);
		C_SearchForPullins(this, file, line);
	}
	// Recursive exec: Parse this file now.
	else if (strnicmp(cmd, "exec", 4) == 0 && isspace(cmd[4]))
	{
		FCommandLine argv(cmd);
		for (int i = 1; i < argv.argc(); ++i)
		{
			C_ParseExecFile(argv[i], this);
		}
	}
	else
	{
		Commands.Push(cmd);
	}
}